

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos1,size_type n1,
          basic_string_view<char,_std::char_traits<char>_> other)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong __n;
  ulong uVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  
  uVar4 = other.size_;
  bVar5 = substr(this,pos1,n1);
  uVar3 = bVar5.size_;
  __n = uVar4;
  if (uVar3 < uVar4) {
    __n = uVar3;
  }
  if ((__n != 0) && (iVar1 = memcmp(bVar5.data_,other.data_,__n), iVar1 != 0)) {
    return iVar1;
  }
  uVar2 = 0;
  if (uVar3 != uVar4) {
    uVar2 = -(uint)(uVar3 < uVar4) | 1;
  }
  return uVar2;
}

Assistant:

nssv_constexpr int compare(size_type pos1, size_type n1, basic_string_view other) const  // (2)
		{
			return substr(pos1, n1).compare(other);
		}